

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interface.h
# Opt level: O0

void Firebird::ThrowStatusWrapper::checkException(ThrowStatusWrapper *status)

{
  uint uVar1;
  FbException *this;
  ThrowStatusWrapper *status_local;
  
  if (((status->super_BaseStatusWrapper<Firebird::ThrowStatusWrapper>).dirty & 1U) != 0) {
    uVar1 = (**(code **)(*(long *)&(status->super_BaseStatusWrapper<Firebird::ThrowStatusWrapper>).
                                   super_IStatusImpl<Firebird::ThrowStatusWrapper,_Firebird::ThrowStatusWrapper,_Firebird::IDisposableImpl<Firebird::ThrowStatusWrapper,_Firebird::ThrowStatusWrapper,_Firebird::Inherit<Firebird::IVersionedImpl<Firebird::ThrowStatusWrapper,_Firebird::ThrowStatusWrapper,_Firebird::Inherit<Firebird::IStatus>_>_>_>_>
                                   .
                                   super_IStatusBaseImpl<Firebird::ThrowStatusWrapper,_Firebird::ThrowStatusWrapper,_Firebird::IDisposableImpl<Firebird::ThrowStatusWrapper,_Firebird::ThrowStatusWrapper,_Firebird::Inherit<Firebird::IVersionedImpl<Firebird::ThrowStatusWrapper,_Firebird::ThrowStatusWrapper,_Firebird::Inherit<Firebird::IStatus>_>_>_>_>
                                   .
                                   super_IDisposableImpl<Firebird::ThrowStatusWrapper,_Firebird::ThrowStatusWrapper,_Firebird::Inherit<Firebird::IVersionedImpl<Firebird::ThrowStatusWrapper,_Firebird::ThrowStatusWrapper,_Firebird::Inherit<Firebird::IStatus>_>_>_>
                                   .
                                   super_IDisposableBaseImpl<Firebird::ThrowStatusWrapper,_Firebird::ThrowStatusWrapper,_Firebird::Inherit<Firebird::IVersionedImpl<Firebird::ThrowStatusWrapper,_Firebird::ThrowStatusWrapper,_Firebird::Inherit<Firebird::IStatus>_>_>_>
                                   .
                                   super_Inherit<Firebird::IVersionedImpl<Firebird::ThrowStatusWrapper,_Firebird::ThrowStatusWrapper,_Firebird::Inherit<Firebird::IStatus>_>_>
                                   .
                                   super_IVersionedImpl<Firebird::ThrowStatusWrapper,_Firebird::ThrowStatusWrapper,_Firebird::Inherit<Firebird::IStatus>_>
                        + 0x20))();
    if ((uVar1 & 2) != 0) {
      this = (FbException *)__cxa_allocate_exception(0x10);
      FbException::FbException
                (this,(status->super_BaseStatusWrapper<Firebird::ThrowStatusWrapper>).status);
      __cxa_throw(this,&FbException::typeinfo,FbException::~FbException);
    }
  }
  return;
}

Assistant:

static void checkException(ThrowStatusWrapper* status)
		{
			if (status->dirty && (status->getState() & IStatus::STATE_ERRORS))
				throw FbException(status->status);
		}